

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

_Bool Mips64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  DecodeStatus DVar1;
  DecodeStatus status;
  cs_struct *handle;
  uint64_t address_local;
  uint16_t *size_local;
  MCInst *instr_local;
  size_t code_len_local;
  uint8_t *code_local;
  csh ud_local;
  
  DVar1 = Mips64Disassembler_getInstruction
                    (*(int *)(ud + 4),instr,code,code_len,size,address,
                     (_Bool)(*(byte *)(ud + 0x28) & 1),(MCRegisterInfo *)info);
  return DVar1 == MCDisassembler_Success;
}

Assistant:

bool Mips64_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *instr,
		uint16_t *size, uint64_t address, void *info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;

	DecodeStatus status = Mips64Disassembler_getInstruction(handle->mode, instr,
			code, code_len,
			size,
			address, handle->big_endian, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}